

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall ImGuiStorage::SetInt(ImGuiStorage *this,ImGuiID key,int val)

{
  ImGuiStoragePair *it_00;
  ImGuiStoragePair *pIVar1;
  ImGuiStoragePair *pIVar2;
  ImGuiStoragePair local_30;
  ImGuiStoragePair *local_20;
  ImGuiStoragePair *it;
  int val_local;
  ImGuiID key_local;
  ImGuiStorage *this_local;
  
  it._0_4_ = val;
  it._4_4_ = key;
  _val_local = this;
  pIVar1 = LowerBound(&this->Data,key);
  local_20 = pIVar1;
  pIVar2 = ImVector<ImGuiStorage::ImGuiStoragePair>::end(&this->Data);
  it_00 = local_20;
  if ((pIVar1 == pIVar2) || (local_20->key != it._4_4_)) {
    ImGuiStoragePair::ImGuiStoragePair(&local_30,it._4_4_,(int)it);
    ImVector<ImGuiStorage::ImGuiStoragePair>::insert(&this->Data,it_00,&local_30);
  }
  else {
    (local_20->field_1).val_i = (int)it;
  }
  return;
}

Assistant:

void ImGuiStorage::SetInt(ImGuiID key, int val)
{
    ImGuiStoragePair* it = LowerBound(Data, key);
    if (it == Data.end() || it->key != key)
    {
        Data.insert(it, ImGuiStoragePair(key, val));
        return;
    }
    it->val_i = val;
}